

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPIMAGE pppJVar5;
  uint local_4c;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr2;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  JSAMPROW inptr;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  uVar1 = cinfo->image_width;
  inptr._0_4_ = num_rows;
  inptr._4_4_ = output_row;
  output_buf_local = (JSAMPIMAGE)input_buf;
  while (inptr._0_4_ = (int)inptr + -1, -1 < (int)inptr) {
    pppJVar5 = output_buf_local + 1;
    outptr0 = (JSAMPROW)*output_buf_local;
    pJVar2 = (*output_buf)[inptr._4_4_];
    pJVar3 = output_buf[1][inptr._4_4_];
    pJVar4 = output_buf[2][inptr._4_4_];
    inptr._4_4_ = inptr._4_4_ + 1;
    for (local_4c = 0; output_buf_local = pppJVar5, local_4c < uVar1; local_4c = local_4c + 1) {
      pJVar2[local_4c] = *outptr0;
      pJVar3[local_4c] = outptr0[1];
      pJVar4[local_4c] = outptr0[2];
      outptr0 = outptr0 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_convert (j_decompress_ptr cinfo,
	     JSAMPIMAGE input_buf, JDIMENSION input_row,
	     JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED]   = inptr0[col];
      outptr[RGB_GREEN] = inptr1[col];
      outptr[RGB_BLUE]  = inptr2[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}